

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluVarType.cpp
# Opt level: O2

ostream * glu::operator<<(ostream *str,VariableDeclaration *decl)

{
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  int bitNdx;
  int iVar4;
  MemoryAccessQualifier qualifier;
  DeclareVariable local_68;
  
  local_68.varType.m_type = ~TYPE_BASIC;
  local_68.varType._4_4_ = 0xffffffff;
  local_68.varType.m_data.array.elementType = (VarType *)0xdffffffff;
  local_68.varType.m_data.array.size = 2;
  bVar1 = Layout::operator!=(&decl->layout,(Layout *)&local_68);
  if (bVar1) {
    operator<<(str,&decl->layout);
    std::operator<<(str," ");
  }
  for (iVar4 = 0; qualifier = 1 << ((byte)iVar4 & 0x1f), iVar4 != 5; iVar4 = iVar4 + 1) {
    if ((decl->memoryAccessQualifierBits & qualifier) != 0) {
      pcVar2 = getMemoryAccessQualifierName(qualifier);
      poVar3 = std::operator<<(str,pcVar2);
      std::operator<<(poVar3," ");
    }
  }
  if ((long)(int)decl->interpolation != 3) {
    poVar3 = std::operator<<(str,getInterpolationName::s_names[(int)decl->interpolation]);
    std::operator<<(poVar3," ");
  }
  if ((long)(int)decl->storage != 7) {
    poVar3 = std::operator<<(str,getStorageName::s_names[(int)decl->storage]);
    std::operator<<(poVar3," ");
  }
  glu::decl::DeclareVariable::DeclareVariable(&local_68,&decl->varType,&decl->name,0);
  glu::decl::operator<<(str,&local_68);
  glu::decl::DeclareVariable::~DeclareVariable(&local_68);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const VariableDeclaration& decl)
{
	if (decl.layout != Layout())
		str << decl.layout << " ";

	for (int bitNdx = 0; (1 << bitNdx) & MEMORYACCESSQUALIFIER_MASK; ++bitNdx)
		if (decl.memoryAccessQualifierBits & (1 << bitNdx))
			str << getMemoryAccessQualifierName((glu::MemoryAccessQualifier)(1 << bitNdx)) << " ";

	if (decl.interpolation != INTERPOLATION_LAST)
		str << getInterpolationName(decl.interpolation) << " ";

	if (decl.storage != STORAGE_LAST)
		str << getStorageName(decl.storage) << " ";

	str << declare(decl.varType, decl.name);

	return str;
}